

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

Status cmsys::SystemTools::CopyFileAlways(string *source,string *destination)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  Status SVar4;
  Status SVar5;
  ulong uVar6;
  mode_t perm;
  string real_destination;
  string source_name;
  string destination_dir;
  mode_t local_b4;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_b4 = 0;
  SVar4 = GetPermissions(source,&local_b4);
  pcVar2 = (destination->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + destination->_M_string_length);
  bVar3 = FileIsDirectory(source);
  if (bVar3) {
    SVar5 = MakeDirectory(destination,(mode_t *)0x0);
LAB_005d329e:
    uVar6 = (ulong)SVar5 >> 0x20;
    if ((SVar5.Kind_ == Success) && (SVar4.Kind_ == Success)) {
      SVar5 = SetPermissions(&local_b0,local_b4,false);
      uVar6 = (ulong)SVar5 >> 0x20;
    }
  }
  else {
    paVar1 = &local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)paVar1;
    bVar3 = FileIsDirectory(destination);
    if (bVar3) {
      std::__cxx11::string::_M_assign((string *)&local_70);
      ConvertToUnixSlashes(&local_b0);
      std::__cxx11::string::push_back((char)&local_b0);
      pcVar2 = (source->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + source->_M_string_length);
      GetFilenameName(&local_50,&local_90);
      std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
LAB_005d33b3:
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      GetFilenamePath(&local_90,destination);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_005d33b3;
    }
    bVar3 = SameFile(source,&local_b0);
    if (bVar3) {
      SVar5.Kind_ = Success;
      SVar5.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
      uVar6 = 0;
    }
    else {
      if ((local_70._M_string_length == 0) ||
         (SVar5 = MakeDirectory(&local_70,(mode_t *)0x0), SVar5.Kind_ == Success)) {
        SVar5 = CloneFileContent(source,&local_b0);
        if (SVar5.Kind_ != Success) {
          SVar5 = CopyFileContentBlockwise(source,&local_b0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_005d329e;
      }
      uVar6 = (ulong)SVar5 >> 0x20;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return (Status)((ulong)SVar5 & 0xffffffff | uVar6 << 0x20);
}

Assistant:

Status SystemTools::CopyFileAlways(std::string const& source,
                                   std::string const& destination)
{
  Status status;
  mode_t perm = 0;
  Status perms = SystemTools::GetPermissions(source, perm);
  std::string real_destination = destination;

  if (SystemTools::FileIsDirectory(source)) {
    status = SystemTools::MakeDirectory(destination);
    if (!status.IsSuccess()) {
      return status;
    }
  } else {
    // If destination is a directory, try to create a file with the same
    // name as the source in that directory.

    std::string destination_dir;
    if (SystemTools::FileIsDirectory(destination)) {
      destination_dir = real_destination;
      SystemTools::ConvertToUnixSlashes(real_destination);
      real_destination += '/';
      std::string source_name = source;
      real_destination += SystemTools::GetFilenameName(source_name);
    } else {
      destination_dir = SystemTools::GetFilenamePath(destination);
    }
    // If files are the same do not copy
    if (SystemTools::SameFile(source, real_destination)) {
      return status;
    }

    // Create destination directory
    if (!destination_dir.empty()) {
      status = SystemTools::MakeDirectory(destination_dir);
      if (!status.IsSuccess()) {
        return status;
      }
    }

    status = SystemTools::CloneFileContent(source, real_destination);
    // if cloning did not succeed, fall back to blockwise copy
    if (!status.IsSuccess()) {
      status = SystemTools::CopyFileContentBlockwise(source, real_destination);
    }
    if (!status.IsSuccess()) {
      return status;
    }
  }
  if (perms) {
    status = SystemTools::SetPermissions(real_destination, perm);
  }
  return status;
}